

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.h
# Opt level: O0

AlignmentLines *
Alnout::Writer<DNA>::ExtractAlignmentLines
          (AlignmentLines *__return_storage_ptr__,Sequence<DNA> *query,Sequence<DNA> *target,
          Cigar *alignment,size_t *outNumCols,size_t *outNumMatches,size_t *outNumGaps)

{
  undefined8 uVar1;
  bool bVar2;
  char cVar3;
  reference pvVar4;
  char *pcVar5;
  ulong uVar6;
  anon_struct_128_7_d437573b local_248;
  char local_1c6;
  char local_1c5;
  int local_1c4;
  char b;
  char a;
  reference pCStack_1c0;
  int i;
  CigarEntry *c;
  iterator __end2;
  iterator __begin2;
  Cigar *__range2;
  undefined1 local_158 [8];
  AlignmentLine line;
  size_t tcount;
  size_t qcount;
  size_t numGaps;
  size_t numCols;
  size_t numMatches;
  bool match;
  value_type *bce;
  value_type *fce;
  size_t targetStart;
  size_t queryStart;
  Cigar cigar;
  size_t *outNumMatches_local;
  size_t *outNumCols_local;
  Cigar *alignment_local;
  Sequence<DNA> *target_local;
  Sequence<DNA> *query_local;
  AlignmentLines *lines;
  
  cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
  super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)outNumMatches;
  Cigar::Cigar((Cigar *)&queryStart,alignment);
  targetStart = 0;
  fce = (value_type *)0x0;
  bVar2 = std::deque<CigarEntry,_std::allocator<CigarEntry>_>::empty
                    ((deque<CigarEntry,_std::allocator<CigarEntry>_> *)&queryStart);
  if (!bVar2) {
    pvVar4 = std::deque<CigarEntry,_std::allocator<CigarEntry>_>::front
                       ((deque<CigarEntry,_std::allocator<CigarEntry>_> *)&queryStart);
    if (pvVar4->op == Deletion) {
      fce = (value_type *)(long)pvVar4->count;
      std::deque<CigarEntry,_std::allocator<CigarEntry>_>::pop_front
                ((deque<CigarEntry,_std::allocator<CigarEntry>_> *)&queryStart);
    }
    else if (pvVar4->op == Insertion) {
      targetStart = (size_t)pvVar4->count;
      std::deque<CigarEntry,_std::allocator<CigarEntry>_>::pop_front
                ((deque<CigarEntry,_std::allocator<CigarEntry>_> *)&queryStart);
    }
  }
  bVar2 = std::deque<CigarEntry,_std::allocator<CigarEntry>_>::empty
                    ((deque<CigarEntry,_std::allocator<CigarEntry>_> *)&queryStart);
  if (!bVar2) {
    pvVar4 = std::deque<CigarEntry,_std::allocator<CigarEntry>_>::back
                       ((deque<CigarEntry,_std::allocator<CigarEntry>_> *)&queryStart);
    if (pvVar4->op == Deletion) {
      std::deque<CigarEntry,_std::allocator<CigarEntry>_>::pop_back
                ((deque<CigarEntry,_std::allocator<CigarEntry>_> *)&queryStart);
    }
    else if (pvVar4->op == Insertion) {
      std::deque<CigarEntry,_std::allocator<CigarEntry>_>::pop_back
                ((deque<CigarEntry,_std::allocator<CigarEntry>_> *)&queryStart);
    }
  }
  numCols = 0;
  numGaps = 0;
  qcount = 0;
  tcount = targetStart;
  line.a.field_2._8_8_ = fce;
  anon_struct_128_7_d437573b::AlignmentLine((anon_struct_128_7_d437573b *)local_158);
  local_158 = (undefined1  [8])(targetStart + 1);
  line.q.field_2._8_8_ = (long)&fce->count + 1;
  std::
  deque<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>::
  deque(__return_storage_ptr__);
  std::deque<CigarEntry,_std::allocator<CigarEntry>_>::begin
            ((iterator *)&__end2._M_node,
             (deque<CigarEntry,_std::allocator<CigarEntry>_> *)&queryStart);
  std::deque<CigarEntry,_std::allocator<CigarEntry>_>::end
            ((iterator *)&c,(deque<CigarEntry,_std::allocator<CigarEntry>_> *)&queryStart);
  do {
    bVar2 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&c);
    if (!bVar2) {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        line.qs = tcount;
        line.ts = line.a.field_2._8_8_;
        std::
        deque<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_158);
      }
      if (outNumCols != (size_t *)0x0) {
        *outNumCols = numGaps;
      }
      if (cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
          super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_node != (_Map_pointer)0x0) {
        *cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
         super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_node = (CigarEntry *)numCols;
      }
      if (outNumGaps != (size_t *)0x0) {
        *outNumGaps = qcount;
      }
      anon_struct_128_7_d437573b::~AlignmentLine((anon_struct_128_7_d437573b *)local_158);
      Cigar::~Cigar((Cigar *)&queryStart);
      return __return_storage_ptr__;
    }
    pCStack_1c0 = std::_Deque_iterator<CigarEntry,_CigarEntry_&,_CigarEntry_*>::operator*
                            ((_Deque_iterator<CigarEntry,_CigarEntry_&,_CigarEntry_*> *)
                             &__end2._M_node);
    for (local_1c4 = 0; local_1c4 < pCStack_1c0->count; local_1c4 = local_1c4 + 1) {
      switch(pCStack_1c0->op) {
      case Match:
        numCols = numCols + 1;
      case Mismatch:
        cVar3 = Sequence<DNA>::operator[](query,tcount);
        std::__cxx11::string::operator+=((string *)&line.qe,cVar3);
        uVar1 = line.a.field_2._8_8_;
        line.a.field_2._8_8_ = line.a.field_2._8_8_ + 1;
        cVar3 = Sequence<DNA>::operator[](target,uVar1);
        std::__cxx11::string::operator+=((string *)&line.te,cVar3);
        pcVar5 = (char *)std::__cxx11::string::back();
        local_1c5 = *pcVar5;
        pcVar5 = (char *)std::__cxx11::string::back();
        local_1c6 = *pcVar5;
        cVar3 = MatchSymbol(local_1c5,local_1c6);
        std::__cxx11::string::operator+=((string *)(line.t.field_2._M_local_buf + 8),cVar3);
        tcount = tcount + 1;
        break;
      default:
        break;
      case Deletion:
        std::__cxx11::string::operator+=((string *)&line.qe,'-');
        uVar1 = line.a.field_2._8_8_;
        line.a.field_2._8_8_ = line.a.field_2._8_8_ + 1;
        cVar3 = Sequence<DNA>::operator[](target,uVar1);
        std::__cxx11::string::operator+=((string *)&line.te,cVar3);
        std::__cxx11::string::operator+=((string *)(line.t.field_2._M_local_buf + 8),' ');
        qcount = qcount + 1;
        break;
      case Insertion:
        std::__cxx11::string::operator+=((string *)&line.te,'-');
        cVar3 = Sequence<DNA>::operator[](query,tcount);
        std::__cxx11::string::operator+=((string *)&line.qe,cVar3);
        std::__cxx11::string::operator+=((string *)(line.t.field_2._M_local_buf + 8),' ');
        qcount = qcount + 1;
        tcount = tcount + 1;
      }
      numGaps = numGaps + 1;
      if (numGaps % 0x3c == 0) {
        line.qs = tcount;
        line.ts = line.a.field_2._8_8_;
        std::
        deque<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_158);
        memset(&local_248,0,0x80);
        anon_struct_128_7_d437573b::AlignmentLine(&local_248);
        anon_struct_128_7_d437573b::operator=((anon_struct_128_7_d437573b *)local_158,&local_248);
        anon_struct_128_7_d437573b::~AlignmentLine(&local_248);
        local_158 = (undefined1  [8])(tcount + 1);
        line.q.field_2._8_8_ = line.a.field_2._8_8_ + 1;
      }
    }
    std::_Deque_iterator<CigarEntry,_CigarEntry_&,_CigarEntry_*>::operator++
              ((_Deque_iterator<CigarEntry,_CigarEntry_&,_CigarEntry_*> *)&__end2._M_node);
  } while( true );
}

Assistant:

static AlignmentLines ExtractAlignmentLines(
    const Sequence< Alphabet >& query, const Sequence< Alphabet >& target,
    const Cigar& alignment, size_t* outNumCols = NULL,
    size_t* outNumMatches = NULL, size_t* outNumGaps = NULL ) {
    Cigar cigar = alignment;

    size_t queryStart  = 0;
    size_t targetStart = 0;

    // Dont take left terminal gap into account
    if( !cigar.empty() ) {
      const auto& fce = cigar.front();
      if( fce.op == CigarOp::Deletion ) {
        targetStart = fce.count;
        cigar.pop_front();
      } else if( fce.op == CigarOp::Insertion ) {
        queryStart = fce.count;
        cigar.pop_front();
      }
    }

    // Don't take right terminal gap into account
    if( !cigar.empty() ) {
      const auto& bce = cigar.back();
      if( bce.op == CigarOp::Deletion ) {
        cigar.pop_back();
      } else if( bce.op == CigarOp::Insertion ) {
        cigar.pop_back();
      }
    }

    bool   match;
    size_t numMatches = 0;
    size_t numCols    = 0;
    size_t numGaps    = 0;

    size_t qcount = queryStart;
    size_t tcount = targetStart;

    AlignmentLine line;
    line.qs = queryStart + 1;
    line.ts = targetStart + 1;

    AlignmentLines lines;

    for( auto& c : cigar ) {
      for( int i = 0; i < c.count; i++ ) {
        switch( c.op ) {
          case CigarOp::Insertion:
            line.t += '-';
            line.q += query[ qcount++ ];
            line.a += ' ';
            numGaps++;
            break;

          case CigarOp::Deletion:
            line.q += '-';
            line.t += target[ tcount++ ];
            line.a += ' ';
            numGaps++;
            break;

          case CigarOp::Match: // specific for match
            numMatches++;
          case CigarOp::Mismatch: // match and mismatch
            line.q += query[ qcount++ ];
            line.t += target[ tcount++ ];
            {
              const char a = line.q.back(), b = line.t.back();
              line.a += MatchSymbol( a, b );
            }
            break;

          default:
            break;
        }

        numCols++;
        if( numCols % MaxLineLength == 0 ) {
          line.qe = qcount;
          line.te = tcount;
          lines.push_back( line );

          // Start new line
          line    = AlignmentLine();
          line.qs = qcount + 1;
          line.ts = tcount + 1;
        }
      }
    }

    if( !line.a.empty() ) {
      line.qe = qcount;
      line.te = tcount;
      lines.push_back( line );
    }

    if( outNumCols )
      *outNumCols = numCols;

    if( outNumMatches )
      *outNumMatches = numMatches;

    if( outNumGaps )
      *outNumGaps = numGaps;

    return lines;
  }